

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O1

size_t __thiscall
capnp::_::PackedInputStream::tryRead
          (PackedInputStream *this,ArrayPtr<unsigned_char> dstArray,size_t minBytes)

{
  ulong uVar1;
  ArrayPtr<const_unsigned_char> AVar2;
  ArrayPtr<const_unsigned_char> AVar3;
  ArrayPtr<const_unsigned_char> AVar4;
  ArrayPtr<const_unsigned_char> AVar5;
  ArrayPtr<const_unsigned_char> AVar6;
  byte *pbVar7;
  PackedInputStream *pPVar8;
  int iVar9;
  undefined4 extraout_var;
  byte *pbVar11;
  uint uVar10;
  byte bVar13;
  uint uVar14;
  byte *pbVar15;
  size_t extraout_RDX;
  byte *__dest;
  byte *pbVar17;
  byte bVar18;
  long lVar19;
  byte *pbVar20;
  byte *pbVar21;
  long lVar22;
  bool bVar23;
  ArrayPtr<const_unsigned_char> AVar24;
  ArrayPtr<const_unsigned_char> AVar25;
  ArrayPtr<const_unsigned_char> AVar26;
  uint runLength;
  byte *local_b0;
  byte *local_a8;
  byte *local_a0;
  byte *local_98;
  PackedInputStream *local_90;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  uchar *puVar12;
  size_t sVar16;
  
  pbVar15 = (byte *)dstArray.size_;
  local_98 = dstArray.ptr;
  if (pbVar15 != (byte *)0x0) {
    iVar9 = (*(this->inner->super_InputStream)._vptr_InputStream[4])();
    pbVar7 = local_98;
    AVar4.size_ = _kjCondition.left;
    AVar4.ptr = (uchar *)CONCAT44(extraout_var,iVar9);
    AVar25.size_ = extraout_RDX;
    AVar25.ptr = (uchar *)CONCAT44(extraout_var,iVar9);
    if (extraout_RDX != 0) {
      pbVar11 = local_98 + (long)pbVar15;
      pbVar17 = local_98 + minBytes;
      __dest = local_98;
      local_b0 = pbVar17;
      local_90 = this;
      do {
        _kjCondition.left = AVar4.size_;
        puVar12 = AVar4.ptr;
        sVar16 = AVar25.size_;
        pbVar20 = AVar25.ptr;
        if ((ulong)((long)(puVar12 + sVar16) - (long)pbVar20) < 10) {
          if (__dest < pbVar17) {
            if (puVar12 + sVar16 == pbVar20) {
              (*(this->inner->super_InputStream)._vptr_InputStream[3])();
              AVar26 = kj::BufferedInputStream::getReadBuffer(this->inner);
              sVar16 = AVar26.size_;
              puVar12 = AVar26.ptr;
              _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
              _kjCondition.op.content.ptr = " > ";
              _kjCondition.op.content.size_ = 4;
              iVar9 = 7;
              _kjCondition.result = sVar16 != 0;
              if (!_kjCondition.result) {
                _kjCondition.left = sVar16;
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                          (&f,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                           ,0x4f,FAILED,"buffer.size() > 0",
                           "_kjCondition,\"Premature end of packed input.\"",&_kjCondition,
                           (char (*) [31])"Premature end of packed input.");
                pbVar17 = local_b0;
                local_a8 = __dest + -(long)local_98;
                kj::_::Debug::Fault::~Fault(&f);
                AVar26.size_ = _kjCondition.left;
                AVar26.ptr = pbVar20;
                iVar9 = 1;
              }
              _kjCondition.left = AVar26.size_;
              AVar4.size_ = _kjCondition.left;
              AVar4.ptr = puVar12;
              AVar25.size_ = sVar16;
              AVar25.ptr = AVar26.ptr;
            }
            else {
              bVar18 = *pbVar20;
              pbVar20 = pbVar20 + 1;
              lVar19 = 0;
              bVar23 = false;
              local_a0 = __dest;
              do {
                pPVar8 = local_90;
                _kjCondition.left = AVar4.size_;
                AVar24.size_ = sVar16;
                AVar24.ptr = pbVar20;
                if ((bVar18 >> ((uint)lVar19 & 0x1f) & 1) == 0) {
                  bVar13 = 0;
                }
                else {
                  if (AVar4.ptr + sVar16 == pbVar20) {
                    (*(local_90->inner->super_InputStream)._vptr_InputStream[3])();
                    AVar24 = kj::BufferedInputStream::getReadBuffer(pPVar8->inner);
                    _kjCondition.left = AVar24.size_;
                    _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
                    _kjCondition.op.content.ptr = " > ";
                    _kjCondition.op.content.size_ = 4;
                    _kjCondition.result = _kjCondition.left != 0;
                    AVar4 = AVar24;
                    if (!_kjCondition.result) {
                      kj::_::Debug::Fault::
                      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                                (&f,
                                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                                 ,0x5b,FAILED,"buffer.size() > 0",
                                 "_kjCondition,\"Premature end of packed input.\"",&_kjCondition,
                                 (char (*) [31])"Premature end of packed input.");
                      local_a8 = __dest + (lVar19 - (long)pbVar7);
                      kj::_::Debug::Fault::~Fault(&f);
                      __dest = local_a0 + lVar19;
                      iVar9 = 1;
                      goto LAB_001a70b5;
                    }
                  }
                  sVar16 = AVar24.size_;
                  bVar13 = *AVar24.ptr;
                  pbVar20 = AVar24.ptr + 1;
                }
                _kjCondition.left = AVar4.size_;
                AVar24.size_ = sVar16;
                AVar24.ptr = AVar4.ptr;
                __dest[lVar19] = bVar13;
                bVar23 = 6 < (uint)lVar19;
                lVar19 = lVar19 + 1;
              } while ((int)lVar19 != 8);
              __dest = __dest + lVar19;
              iVar9 = 0xd;
LAB_001a70b5:
              this = local_90;
              pbVar17 = local_b0;
              sVar16 = AVar24.size_;
              puVar12 = AVar24.ptr;
              AVar4.size_ = _kjCondition.left;
              AVar4.ptr = puVar12;
              AVar6.size_ = _kjCondition.left;
              AVar6.ptr = puVar12;
              AVar25.size_ = sVar16;
              AVar25.ptr = pbVar20;
              AVar2.size_ = sVar16;
              AVar2.ptr = pbVar20;
              if (bVar23) {
                AVar5 = AVar4;
                if ((puVar12 + sVar16 == pbVar20) &&
                   (AVar25 = AVar2, AVar5 = AVar6, (byte)(bVar18 + 1) < 2)) {
                  (*(local_90->inner->super_InputStream)._vptr_InputStream[3])();
                  AVar25 = kj::BufferedInputStream::getReadBuffer(this->inner);
                  _kjCondition.left = AVar25.size_;
                  AVar3.size_ = _kjCondition.left;
                  AVar3.ptr = pbVar20;
                  puVar12 = AVar25.ptr;
                  _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
                  _kjCondition.op.content.ptr = " > ";
                  _kjCondition.op.content.size_ = 4;
                  _kjCondition.result = _kjCondition.left != 0;
                  AVar5 = AVar25;
                  if (!_kjCondition.result) {
                    kj::_::Debug::Fault::
                    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                              (&f,
                               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                               ,100,FAILED,"buffer.size() > 0",
                               "_kjCondition,\"Premature end of packed input.\"",&_kjCondition,
                               (char (*) [31])"Premature end of packed input.");
                    pbVar17 = local_b0;
                    local_a8 = __dest + -(long)local_98;
                    kj::_::Debug::Fault::~Fault(&f);
                    AVar25 = AVar3;
                    goto LAB_001a73af;
                  }
                }
                goto LAB_001a727e;
              }
            }
          }
          else {
            (*(this->inner->super_InputStream)._vptr_InputStream[3])();
            local_a8 = __dest + -(long)local_98;
LAB_001a73af:
            AVar4.size_ = _kjCondition.left;
            AVar4.ptr = puVar12;
            iVar9 = 1;
          }
        }
        else {
          bVar18 = *pbVar20;
          bVar13 = pbVar20[1];
          if ((bVar18 & 1) == 0) {
            bVar13 = 0;
          }
          *__dest = bVar13;
          lVar19 = (ulong)(bVar18 & 1) + 1;
          uVar14 = bVar18 >> 1 & 1;
          __dest[1] = -(char)uVar14 & pbVar20[(ulong)(bVar18 & 1) + 1];
          uVar10 = bVar18 >> 2 & 1;
          lVar22 = (ulong)uVar14 + lVar19;
          __dest[2] = -(char)uVar10 & pbVar20[(ulong)uVar14 + lVar19];
          lVar19 = (ulong)uVar10 + lVar22;
          uVar14 = bVar18 >> 3 & 1;
          __dest[3] = -(char)uVar14 & pbVar20[(ulong)uVar10 + lVar22];
          lVar22 = (ulong)uVar14 + lVar19;
          uVar10 = bVar18 >> 4 & 1;
          __dest[4] = -(char)uVar10 & pbVar20[(ulong)uVar14 + lVar19];
          lVar19 = (ulong)uVar10 + lVar22;
          uVar14 = bVar18 >> 5 & 1;
          __dest[5] = -(char)uVar14 & pbVar20[(ulong)uVar10 + lVar22];
          uVar10 = bVar18 >> 6 & 1;
          lVar22 = (ulong)uVar14 + lVar19;
          __dest[6] = -(char)uVar10 & pbVar20[(ulong)uVar14 + lVar19];
          __dest[7] = (char)bVar18 >> 7 & pbVar20[(ulong)uVar10 + lVar22];
          __dest = __dest + 8;
          AVar25.size_ = sVar16;
          AVar25.ptr = pbVar20 + (ulong)(bVar18 >> 7) + (ulong)uVar10 + lVar22;
          AVar5 = AVar4;
LAB_001a727e:
          pbVar20 = AVar5.ptr;
          sVar16 = AVar25.size_;
          pbVar21 = AVar25.ptr;
          if (bVar18 == 0xff) {
            uVar1 = (ulong)*pbVar21;
            lVar19 = uVar1 * 8;
            runLength = (uint)lVar19;
            lVar22 = (long)pbVar11 - (long)__dest;
            _kjCondition.left = (unsigned_long)&runLength;
            _kjCondition.op.content.ptr = " <= ";
            _kjCondition.op.content.size_ = 5;
            bVar23 = (long)(lVar22 + uVar1 * -8) < 0;
            _kjCondition.result = SBORROW8(lVar22,lVar19) == bVar23;
            local_a0 = pbVar20;
            _kjCondition._8_8_ = lVar22;
            if (SBORROW8(lVar22,lVar19) != bVar23) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,long>&,char_const(&)[56]>
                        (&f,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                         ,0x8d,FAILED,"runLength <= outEnd - out",
                         "_kjCondition,\"Packed input did not end cleanly on a segment boundary.\"",
                         (DebugComparison<unsigned_int_&,_long> *)&_kjCondition,
                         (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
              pbVar20 = local_a0;
              local_a8 = __dest + -(long)local_98;
              kj::_::Debug::Fault::~Fault(&f);
            }
            this = local_90;
            pbVar21 = pbVar21 + 1;
            AVar25.size_ = sVar16;
            AVar25.ptr = pbVar21;
            iVar9 = 1;
            if (SBORROW8(lVar22,lVar19) == (long)(lVar22 + uVar1 * -8) < 0) {
              pbVar20 = pbVar20 + (sVar16 - (long)pbVar21);
              if (pbVar20 < (byte *)(ulong)runLength) {
                memcpy(__dest,pbVar21,(size_t)pbVar20);
                runLength = runLength - (int)pbVar20;
                (*(this->inner->super_InputStream)._vptr_InputStream[3])(this->inner,sVar16);
                kj::InputStream::read
                          (&this->inner->super_InputStream,(int)(__dest + (long)pbVar20),
                           (void *)(ulong)runLength,(size_t)(ulong)runLength);
                __dest = __dest + (long)pbVar20 + runLength;
                if (__dest != pbVar11) {
                  AVar25 = kj::BufferedInputStream::getReadBuffer(this->inner);
                  iVar9 = 7;
                  bVar23 = false;
                  pbVar20 = AVar25.ptr;
                  goto LAB_001a7623;
                }
                bVar23 = false;
                iVar9 = 1;
                local_a8 = pbVar15;
              }
              else {
                memcpy(__dest,pbVar21,(size_t)(ulong)runLength);
                __dest = __dest + runLength;
                pbVar21 = pbVar21 + runLength;
                iVar9 = 0;
                bVar23 = true;
              }
              AVar25.ptr = pbVar21;
              pbVar20 = local_a0;
            }
            else {
              bVar23 = false;
            }
LAB_001a7623:
            AVar5.size_ = _kjCondition.left;
            AVar5.ptr = pbVar20;
            pbVar17 = local_b0;
            AVar4 = AVar5;
            if (!bVar23) goto LAB_001a7662;
          }
          else if (bVar18 == 0) {
            uVar1 = (ulong)*pbVar21;
            lVar19 = uVar1 * 8;
            runLength = (uint)lVar19;
            lVar22 = (long)pbVar11 - (long)__dest;
            _kjCondition.left = (unsigned_long)&runLength;
            _kjCondition.op.content.ptr = " <= ";
            _kjCondition.op.content.size_ = 5;
            bVar23 = (long)(lVar22 + uVar1 * -8) < 0;
            _kjCondition.result = SBORROW8(lVar22,lVar19) == bVar23;
            _kjCondition._8_8_ = lVar22;
            if (SBORROW8(lVar22,lVar19) != bVar23) {
              local_a0 = pbVar20;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,long>&,char_const(&)[56]>
                        (&f,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                         ,0x81,FAILED,"runLength <= outEnd - out",
                         "_kjCondition,\"Packed input did not end cleanly on a segment boundary.\"",
                         (DebugComparison<unsigned_int_&,_long> *)&_kjCondition,
                         (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
              pbVar20 = local_a0;
              local_a8 = __dest + -(long)local_98;
              kj::_::Debug::Fault::~Fault(&f);
            }
            if (SBORROW8(lVar22,lVar19) == (long)(lVar22 + uVar1 * -8) < 0) {
              memset(__dest,0,(ulong)runLength);
              __dest = __dest + runLength;
            }
            AVar4.size_ = _kjCondition.left;
            AVar4.ptr = pbVar20;
            AVar5.size_ = _kjCondition.left;
            AVar5.ptr = pbVar20;
            AVar25.size_ = sVar16;
            AVar25.ptr = pbVar21 + 1;
            iVar9 = 1;
            pbVar17 = local_b0;
            this = local_90;
            if (SBORROW8(lVar22,lVar19) != (long)(lVar22 + uVar1 * -8) < 0) goto LAB_001a7662;
          }
          _kjCondition.left = AVar5.size_;
          iVar9 = 0;
          AVar4 = AVar5;
          if (__dest == pbVar11) {
            (*(this->inner->super_InputStream)._vptr_InputStream[3])();
            AVar4.size_ = _kjCondition.left;
            AVar4.ptr = AVar5.ptr;
            iVar9 = 1;
            local_a8 = pbVar15;
          }
        }
LAB_001a7662:
        if ((iVar9 != 0) && (iVar9 != 7)) {
          return (size_t)local_a8;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

size_t PackedInputStream::tryRead(kj::ArrayPtr<byte> dstArray, size_t minBytes) {
  auto maxBytes = dstArray.size();
  uint8_t* const dst = dstArray.begin();
  if (maxBytes == 0) {
    return 0;
  }

  KJ_DREQUIRE(minBytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");
  KJ_DREQUIRE(maxBytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");

  uint8_t* __restrict__ out = dst;
  uint8_t* const outEnd = dst + maxBytes;
  uint8_t* const outMin = dst + minBytes;

  kj::ArrayPtr<const byte> buffer = inner.tryGetReadBuffer();
  if (buffer.size() == 0) {
    return 0;
  }
  const uint8_t* __restrict__ in = reinterpret_cast<const uint8_t*>(buffer.begin());

#define REFRESH_BUFFER() \
  inner.skip(buffer.size()); \
  buffer = inner.getReadBuffer(); \
  KJ_REQUIRE(buffer.size() > 0, "Premature end of packed input.") { \
    return out - dst; \
  } \
  in = reinterpret_cast<const uint8_t*>(buffer.begin())

#define BUFFER_END (reinterpret_cast<const uint8_t*>(buffer.end()))
#define BUFFER_REMAINING ((size_t)(BUFFER_END - in))

  for (;;) {
    uint8_t tag;

    KJ_DASSERT((out - dst) % sizeof(word) == 0,
           "Output pointer should always be aligned here.");

    if (BUFFER_REMAINING < 10) {
      if (out >= outMin) {
        // We read at least the minimum amount, so go ahead and return.
        inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
        return out - dst;
      }

      if (BUFFER_REMAINING == 0) {
        REFRESH_BUFFER();
        continue;
      }

      // We have at least 1, but not 10, bytes available.  We need to read slowly, doing a bounds
      // check on each byte.

      tag = *in++;

      for (uint i = 0; i < 8; i++) {
        if (tag & (1u << i)) {
          if (BUFFER_REMAINING == 0) {
            REFRESH_BUFFER();
          }
          *out++ = *in++;
        } else {
          *out++ = 0;
        }
      }

      if (BUFFER_REMAINING == 0 && (tag == 0 || tag == 0xffu)) {
        REFRESH_BUFFER();
      }
    } else {
      tag = *in++;

#define HANDLE_BYTE(n) \
      { \
         bool isNonzero = (tag & (1u << n)) != 0; \
         *out++ = *in & (-(int8_t)isNonzero); \
         in += isNonzero; \
      }

      HANDLE_BYTE(0);
      HANDLE_BYTE(1);
      HANDLE_BYTE(2);
      HANDLE_BYTE(3);
      HANDLE_BYTE(4);
      HANDLE_BYTE(5);
      HANDLE_BYTE(6);
      HANDLE_BYTE(7);
#undef HANDLE_BYTE
    }

    if (tag == 0) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= outEnd - out,
                 "Packed input did not end cleanly on a segment boundary.") {
        return out - dst;
      }
      memset(out, 0, runLength);
      out += runLength;

    } else if (tag == 0xffu) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= outEnd - out,
                 "Packed input did not end cleanly on a segment boundary.") {
        return out - dst;
      }

      size_t inRemaining = BUFFER_REMAINING;
      if (inRemaining >= runLength) {
        // Fast path.
        memcpy(out, in, runLength);
        out += runLength;
        in += runLength;
      } else {
        // Copy over the first buffer, then do one big read for the rest.
        memcpy(out, in, inRemaining);
        out += inRemaining;
        runLength -= inRemaining;

        inner.skip(buffer.size());
        inner.read(kj::arrayPtr(out, (size_t)runLength));
        out += runLength;

        if (out == outEnd) {
          return maxBytes;
        } else {
          buffer = inner.getReadBuffer();
          in = reinterpret_cast<const uint8_t*>(buffer.begin());

          // Skip the bounds check below since we just did the same check above.
          continue;
        }
      }
    }

    if (out == outEnd) {
      inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
      return maxBytes;
    }
  }

  KJ_FAIL_ASSERT("Can't get here.");
  return 0;  // GCC knows KJ_FAIL_ASSERT doesn't return, but Eclipse CDT still warns...

#undef REFRESH_BUFFER
}